

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O1

IMesh * __thiscall
irr::scene::CAnimatedMeshSceneNode::getMeshForCurrentFrame(CAnimatedMeshSceneNode *this)

{
  CSkinnedMesh *this_00;
  int iVar1;
  undefined4 extraout_var;
  pointer ppIVar2;
  ulong uVar3;
  float fVar4;
  float __x;
  float fVar5;
  undefined4 uVar6;
  
  iVar1 = (*(this->Mesh->super_IMesh)._vptr_IMesh[7])();
  if (iVar1 == 0xb) {
    this_00 = (CSkinnedMesh *)this->Mesh;
    if (this->JointMode == EJUOR_CONTROL) {
      CSkinnedMesh::transferJointsToMesh(this_00,&this->JointChildSceneNodes);
    }
    else {
      uVar6 = (**(code **)(*(long *)this + 0x158))(this);
      (**(code **)(*(long *)this_00 + 0xa0))(uVar6,0x3f800000,this_00);
    }
    (**(code **)(*(long *)this_00 + 0xa8))(this_00);
    if (this->JointMode == EJUOR_READ) {
      CSkinnedMesh::recoverJointsFromMesh(this_00,&this->JointChildSceneNodes);
      ppIVar2 = (this->JointChildSceneNodes).m_data.
                super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->JointChildSceneNodes).m_data.
                              super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3) != 0
         ) {
        uVar3 = 0;
        do {
          if ((CAnimatedMeshSceneNode *)(ppIVar2[uVar3]->super_ISceneNode).Parent == this) {
            (**(code **)((long)(ppIVar2[uVar3]->super_ISceneNode)._vptr_ISceneNode + 0x148))();
          }
          uVar3 = uVar3 + 1;
          ppIVar2 = (this->JointChildSceneNodes).m_data.
                    super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar3 < ((ulong)((long)(this->JointChildSceneNodes).m_data.
                                        super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2)
                          >> 3 & 0xffffffff));
      }
    }
    if (this->JointMode == EJUOR_CONTROL) {
      (**(code **)(*(long *)this_00 + 0x128))(this_00);
    }
    return (IMesh *)this_00;
  }
  fVar4 = (float)(**(code **)(*(long *)this + 0x158))(this);
  __x = (float)(**(code **)(*(long *)this + 0x158))(this);
  fVar5 = floorf(__x);
  iVar1 = (*(this->Mesh->super_IMesh)._vptr_IMesh[0xd])
                    (this->Mesh,(ulong)(uint)(int)fVar4,(ulong)(uint)(int)((__x - fVar5) * 1000.0),
                     (ulong)(uint)this->StartFrame,(ulong)(uint)this->EndFrame);
  return (IMesh *)CONCAT44(extraout_var,iVar1);
}

Assistant:

IMesh *CAnimatedMeshSceneNode::getMeshForCurrentFrame()
{
	if (Mesh->getMeshType() != EAMT_SKINNED) {
		s32 frameNr = (s32)getFrameNr();
		s32 frameBlend = (s32)(core::fract(getFrameNr()) * 1000.f);
		return Mesh->getMesh(frameNr, frameBlend, StartFrame, EndFrame);
	} else {
		// As multiple scene nodes may be sharing the same skinned mesh, we have to
		// re-animate it every frame to ensure that this node gets the mesh that it needs.

		CSkinnedMesh *skinnedMesh = static_cast<CSkinnedMesh *>(Mesh);

		if (JointMode == EJUOR_CONTROL) // write to mesh
			skinnedMesh->transferJointsToMesh(JointChildSceneNodes);
		else
			skinnedMesh->animateMesh(getFrameNr(), 1.0f);

		// Update the skinned mesh for the current joint transforms.
		skinnedMesh->skinMesh();

		if (JointMode == EJUOR_READ) { // read from mesh
			skinnedMesh->recoverJointsFromMesh(JointChildSceneNodes);

			//---slow---
			for (u32 n = 0; n < JointChildSceneNodes.size(); ++n)
				if (JointChildSceneNodes[n]->getParent() == this) {
					JointChildSceneNodes[n]->updateAbsolutePositionOfAllChildren(); // temp, should be an option
				}
		}

		if (JointMode == EJUOR_CONTROL) {
			// For meshes other than EJUOR_CONTROL, this is done by calling animateMesh()
			skinnedMesh->updateBoundingBox();
		}

		return skinnedMesh;
	}
}